

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iremga20.c
# Opt level: O2

void IremGA20_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  UINT8 *pUVar1;
  DEV_SMPL *__s;
  DEV_SMPL *__s_00;
  UINT32 UVar2;
  ulong uVar3;
  IremGA20_channel_def *ch;
  int iVar4;
  int iVar5;
  long lVar6;
  bool bVar7;
  
  __s = *outputs;
  __s_00 = outputs[1];
  if (*(long *)((long)param + 0x20) == 0) {
    memset(__s,0,(ulong)samples << 2);
    memset(__s_00,0,(ulong)samples << 2);
    return;
  }
  for (uVar3 = 0; uVar3 != samples; uVar3 = uVar3 + 1) {
    iVar5 = 0;
    lVar6 = 4;
    ch = (IremGA20_channel_def *)((long)param + 0x4c);
    while (bVar7 = lVar6 != 0, lVar6 = lVar6 + -1, bVar7) {
      if ((ch->Muted == '\0') && (ch->play != '\0')) {
        if (*(char *)((long)param + 0xbc) == '\0') {
          iVar4 = (uint)ch->volume * (int)ch->smpl1;
          UVar2 = ch->frac;
        }
        else {
          UVar2 = ch->frac;
          iVar4 = (int)((uint)ch->volume *
                       ((int)ch->smpl2 * UVar2 + (0x10000 - UVar2) * (int)ch->smpl1)) >> 0x10;
        }
        iVar5 = iVar4 + iVar5;
        ch->frac = UVar2 + ch->fracrate;
        pUVar1 = &ch->counter;
        *pUVar1 = *pUVar1 + '\x01';
        if (*pUVar1 == '\0') {
          ch->pos = ch->pos + 1;
          ch->frac = 0;
          ch->counter = ch->rate;
          irem_ga20_cache_samples((ga20_state *)param,ch);
        }
      }
      ch = ch + 1;
    }
    __s[uVar3] = iVar5 >> 2;
    __s_00[uVar3] = iVar5 >> 2;
  }
  return;
}

Assistant:

static void IremGA20_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	ga20_state *chip = (ga20_state *)param;
	DEV_SMPL *outL, *outR;
	UINT32 i;
	int j;
	DEV_SMPL smpl_int;
	DEV_SMPL sampleout;
	struct IremGA20_channel_def* ch;

	outL = outputs[0];
	outR = outputs[1];
	if (chip->rom == NULL)
	{
		memset(outL, 0, samples * sizeof(DEV_SMPL));
		memset(outR, 0, samples * sizeof(DEV_SMPL));
		return;
	}

	for (i = 0; i < samples; i++)
	{
		sampleout = 0;

		for (j = 0; j < 4; j++)
		{
			ch = &chip->channel[j];
			if (ch->Muted || ! ch->play)
				continue;
			
			if (! chip->interpolate)
			{
				sampleout += ch->smpl1 * (INT32)ch->volume;
			}
			else
			{
				smpl_int = (ch->smpl1 * ((1 << RATE_SHIFT) - ch->frac) + ch->smpl2 * ch->frac);
				sampleout += (smpl_int * (INT32)ch->volume) >> RATE_SHIFT;
			}
			ch->frac += ch->fracrate;
			ch->counter ++;
			if (! ch->counter)
			{
				// advance position + reset counter on overflow
				ch->pos ++;
				ch->frac = 0;
				ch->counter = ch->rate;
				irem_ga20_cache_samples(chip, ch);
			}
		}

		sampleout >>= 2;
		outL[i] = sampleout;
		outR[i] = sampleout;
	}
}